

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

string * make_foreign_string<char16_t>
                   (string *__return_storage_ptr__,
                   basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,in_string._M_str,in_string._M_str + in_string._M_len);
  jessilib::string_byteswap<char16_t>(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string make_foreign_string(std::basic_string_view<CharT> in_string) {
	std::string result{ reinterpret_cast<const char*>(in_string.data()),
		reinterpret_cast<const char*>(in_string.data() + in_string.size()) };
	jessilib::string_byteswap<CharT>(result);

	return result;
}